

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O3

string * __thiscall
om::net::ip4_addr::to_string_abi_cxx11_(string *__return_storage_ptr__,ip4_addr *this)

{
  ostream *poVar1;
  stringstream ss;
  char local_1a1;
  stringstream local_1a0 [16];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  local_1a1 = '.';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1a1,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  local_1a1 = '.';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1a1,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  local_1a1 = '.';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1a1,1);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const
			{
				std::stringstream ss;
				ss << (_addr >> 0  & 0x000000ff) << '.';
				ss << (_addr >> 8  & 0x000000ff) << '.';
				ss << (_addr >> 16 & 0x000000ff) << '.';
				ss << (_addr >> 24 & 0x000000ff);
				return ss.str();
			}